

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InstructionFolder::FoldInstructionInternal(InstructionFolder *this,Instruction *inst)

{
  pointer *this_00;
  pointer pfVar1;
  Instruction *this_01;
  ConstantManager *this_02;
  FoldingRuleSet *pFVar2;
  bool bVar3;
  FoldingRule *rule;
  pointer this_03;
  bool bVar4;
  initializer_list<unsigned_int> init_list;
  uint32_t local_cc;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  constants;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  SmallVector<unsigned_int,_2UL> local_58;
  
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<unsigned_int_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp:181:23)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<unsigned_int_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp:181:23)>
             ::_M_manager;
  this_01 = FoldInstructionToConstant(this,inst,(function<unsigned_int_(unsigned_int)> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (this_01 == (Instruction *)0x0) {
    this_02 = IRContext::get_constant_mgr(this->context_);
    analysis::ConstantManager::GetOperandConstants(&constants,this_02,inst);
    pFVar2 = FoldingRules::GetRulesForInstruction
                       ((this->folding_rules_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
                        .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl,
                        inst);
    this_03 = (pFVar2->
              super__Vector_base<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pfVar1 = (pFVar2->
             super__Vector_base<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    do {
      bVar4 = this_03 == pfVar1;
      bVar3 = !bVar4;
      if (bVar4) break;
      bVar4 = std::
              function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
              ::operator()(this_03,this->context_,inst,&constants);
      this_03 = this_03 + 1;
    } while (!bVar4);
    std::
    _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
    ::~_Vector_base(&constants.
                     super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                   );
  }
  else {
    inst->opcode_ = OpCopyObject;
    local_cc = Instruction::result_id(this_01);
    init_list._M_len = 1;
    init_list._M_array = &local_cc;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
    this_00 = &constants.
               super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    constants.
    super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)this_00,&local_58);
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_78,
               &constants,&local_98);
    Instruction::SetInOperands(inst,(OperandList *)&local_78);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_78)
    ;
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)this_00);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool InstructionFolder::FoldInstructionInternal(Instruction* inst) const {
  auto identity_map = [](uint32_t id) { return id; };
  Instruction* folded_inst = FoldInstructionToConstant(inst, identity_map);
  if (folded_inst != nullptr) {
    inst->SetOpcode(spv::Op::OpCopyObject);
    inst->SetInOperands({{SPV_OPERAND_TYPE_ID, {folded_inst->result_id()}}});
    return true;
  }

  analysis::ConstantManager* const_manager = context_->get_constant_mgr();
  std::vector<const analysis::Constant*> constants =
      const_manager->GetOperandConstants(inst);

  for (const FoldingRule& rule :
       GetFoldingRules().GetRulesForInstruction(inst)) {
    if (rule(context_, inst, constants)) {
      return true;
    }
  }
  return false;
}